

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O1

void Acec_MultFuncTest6(void)

{
  uint uVar1;
  Vec_Wrd_t *vRes;
  word *pwVar2;
  long lVar3;
  word Entry;
  word Canon;
  word Truth;
  word local_48;
  word local_40;
  uint local_38 [2];
  
  vRes = (Vec_Wrd_t *)malloc(0x10);
  vRes->nCap = 10000;
  vRes->nSize = 0;
  pwVar2 = (word *)malloc(80000);
  vRes->pArray = pwVar2;
  local_38[0] = 0x76543210;
  local_38[1] = 0xfedcba98;
  local_40 = Extra_TruthCanonNPN3(0xfedcba9876543210,6,vRes);
  Extra_PrintHex(_stdout,local_38,6);
  putchar(10);
  Extra_PrintHex(_stdout,(uint *)&local_40,6);
  putchar(10);
  uVar1 = vRes->nSize;
  printf("Members = %d.\n",(ulong)uVar1);
  if (0 < (long)(int)uVar1) {
    pwVar2 = vRes->pArray;
    lVar3 = 0;
    do {
      local_48 = pwVar2[lVar3];
      Extra_PrintHex(_stdout,(uint *)&local_48,6);
      printf(", ");
      if ((~(uint)lVar3 & 7) == 0) {
        putchar(10);
      }
      lVar3 = lVar3 + 1;
    } while ((int)uVar1 != lVar3);
  }
  if (vRes->pArray != (word *)0x0) {
    free(vRes->pArray);
    vRes->pArray = (word *)0x0;
  }
  free(vRes);
  return;
}

Assistant:

void Acec_MultFuncTest6()
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 10000 );
    int i; word Entry;

    word Truth = ABC_CONST(0xfedcba9876543210);
    word Canon = Extra_TruthCanonNPN3( Truth, 6, vRes );

    Extra_PrintHex( stdout, (unsigned*)&Truth, 6 );  printf( "\n" );
    Extra_PrintHex( stdout, (unsigned*)&Canon, 6 );  printf( "\n" );

    printf( "Members = %d.\n", Vec_WrdSize(vRes) );
    Vec_WrdForEachEntry( vRes, Entry, i )
    {
        Extra_PrintHex( stdout, (unsigned*)&Entry, 6 );  
        printf( ", " );
        if ( i % 8 == 7 )
            printf( "\n" );
    }

    Vec_WrdFree( vRes );
}